

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZMultiphysicsElement_*,_7>::~TPZManVector
          (TPZManVector<TPZMultiphysicsElement_*,_7> *this)

{
  ~TPZManVector(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}